

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O3

void __thiscall JsonNumber_Uint64Max_Test::TestBody(JsonNumber_Uint64Max_Test *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  int iVar4;
  TypedExpectation<std::error_code_(unsigned_long)> *this_00;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_01;
  char *in_R9;
  string __str;
  string local_f8;
  AssertHelper local_d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  undefined1 local_c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  undefined1 local_b8 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  local_b0;
  int local_60;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  psVar1 = &local_b0.
            super__Deque_base<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
  local_b8 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct((ulong)local_b8,'\x14');
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_b8,
             (uint)local_b0.
                   super__Deque_base<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map,0xffffffffffffffff);
  iVar4 = std::__cxx11::string::compare(local_b8);
  if (iVar4 == 0) {
    if (local_b8 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_b8,
                      (ulong)((long)(_func_bool_MatcherBase<unsigned_long>_ptr_unsigned_long_ptr_MatchResultListener_ptr
                                     **)local_b0.
                                        super__Deque_base<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_map_size + 1));
    }
    testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_f8,0xffffffffffffffff)
    ;
    mock_json_callbacks::gmock_uint64_value
              ((MockSpec<std::error_code_(unsigned_long)> *)local_b8,
               &(this->super_JsonNumber).callbacks_.super_mock_json_callbacks,
               (Matcher<unsigned_long> *)&local_f8);
    testing::internal::GetWithoutMatchers();
    this_00 = testing::internal::MockSpec<std::error_code_(unsigned_long)>::InternalExpectedAt
                        ((MockSpec<std::error_code_(unsigned_long)> *)local_b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                         ,0xd1,"callbacks_","uint64_value (uint64_max)");
    testing::internal::TypedExpectation<std::error_code_(unsigned_long)>::Times(this_00,1);
    testing::internal::MatcherBase<unsigned_long>::~MatcherBase
              ((MatcherBase<unsigned_long> *)&local_b0);
    testing::internal::MatcherBase<unsigned_long>::~MatcherBase
              ((MatcherBase<unsigned_long> *)&local_f8);
    pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
              ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b8,
               (this->super_JsonNumber).proxy_.original_,none);
    paVar2 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"18446744073709551615","");
    _Var3._M_p = local_f8._M_dataplus._M_p;
    pstore::gsl::details::extent_type<-1L>::extent_type
              ((extent_type<_1L> *)local_c8,local_f8._M_string_length);
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var3._M_p;
    this_01 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
              input<pstore::gsl::span<char_const,_1l>>
                        ((parser<callbacks_proxy<mock_json_callbacks>> *)local_b8,
                         (span<const_char,__1L> *)local_c8);
    pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_c8[0] = local_60 == 0;
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    if (local_60 != 0) {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_f8,(internal *)local_c8,(AssertionResult *)"p.has_error ()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                 ,0xd4,local_f8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
      if (local_c0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
    ::~deque(&local_b0);
    if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
         )local_b8 != (singleton_storage<callbacks_proxy<mock_json_callbacks>_> *)0x0) {
      operator_delete((void *)local_b8,0x68);
    }
    return;
  }
  pstore::assert_failed
            ("uint64_max_str == std::to_string (uint64_max) && \"The hard-wired unsigned 64-bit max string seems to be incorrect\""
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
             ,0xd0);
}

Assistant:

TEST_F (JsonNumber, Uint64Max) {
    PSTORE_ASSERT (uint64_max_str == std::to_string (uint64_max) &&
                   "The hard-wired unsigned 64-bit max string seems to be incorrect");
    EXPECT_CALL (callbacks_, uint64_value (uint64_max)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (std::string{uint64_max_str}).eof ();
    EXPECT_FALSE (p.has_error ());
}